

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::checkSolution(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *sol)

{
  bool bVar1;
  int iVar2;
  int __c;
  self_type *in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  int k;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  activity;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  undefined7 in_stack_fffffffffffffd40;
  byte in_stack_fffffffffffffd47;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd54;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd70;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd80;
  undefined1 local_260 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdb0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdb8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffdc0;
  undefined1 local_228 [112];
  undefined1 local_1b8 [56];
  undefined1 local_180 [56];
  undefined1 local_148 [56];
  uint local_110;
  undefined4 local_10c;
  undefined1 local_108 [56];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d0;
  int local_c4;
  undefined8 local_a0;
  undefined4 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined4 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_c4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x44ae2e);
  do {
    local_c4 = local_c4 + -1;
    if (local_c4 < 0) {
      return true;
    }
    local_d0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::rowVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                           in_stack_fffffffffffffd3c);
    local_10c = 0;
    local_90 = local_108;
    local_98 = &local_10c;
    local_a0 = 0;
    local_48 = local_98;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (longlong)in_stack_fffffffffffffd48,
               (type *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    local_110 = 0;
    while (in_stack_fffffffffffffd54 = local_110,
          iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_d0), (int)in_stack_fffffffffffffd54 < iVar2) {
      in_stack_fffffffffffffd48 =
           SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::value(local_d0,local_110);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index(local_d0,(char *)(ulong)local_110,__c);
      local_38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                              in_stack_fffffffffffffd3c);
      local_28 = local_148;
      local_30 = in_stack_fffffffffffffd48;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,in_stack_fffffffffffffd48,local_38);
      local_20 = local_148;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
      local_8 = local_148;
      local_10 = local_30;
      local_18 = local_38;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (cpp_dec_float<50U,_int,_void> *)0x44afdb);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator+=(in_RDI,in_RDX);
      local_110 = local_110 + 1;
    }
    local_80 = local_180;
    local_88 = local_108;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    local_78 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd3c);
    local_70 = local_1b8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    feastol(in_stack_fffffffffffffd78);
    bVar1 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0
                      );
    in_stack_fffffffffffffd47 = 1;
    if (bVar1) {
      local_60 = local_228;
      local_68 = local_108;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)CONCAT17(1,in_stack_fffffffffffffd40),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      local_58 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                       in_stack_fffffffffffffd3c);
      local_50 = local_260;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      feastol(in_stack_fffffffffffffd78);
      bVar1 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffd80,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      in_stack_fffffffffffffd47 = bVar1 ^ 0xff;
    }
  } while ((in_stack_fffffffffffffd47 & 1) == 0);
  return false;
}

Assistant:

bool SPxMainSM<R>::checkSolution(SPxLPBase<R>& lp, VectorBase<R> sol)
{
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);
      R activity = 0;

      for(int k = 0; k < row.size(); k++)
         activity += row.value(k) * sol[row.index(k)];

      if(!GE(activity, lp.lhs(i), feastol()) || !LE(activity, lp.rhs(i), feastol()))
         return false;
   }

   return true;
}